

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalArray<int> *siga)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppSVar3;
  uint local_30 [2];
  uint i;
  allocator<const_dynamicgraph::SignalBase<int>_*> local_19;
  SignalArray<int> *local_18;
  SignalArray<int> *siga_local;
  SignalArray_const<int> *this_local;
  
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_00136950;
  local_18 = siga;
  siga_local = (SignalArray<int> *)this;
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])();
  std::allocator<const_dynamicgraph::SignalBase<int>_*>::allocator(&local_19);
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&this->const_array,(ulong)uVar1,&local_19);
  std::allocator<const_dynamicgraph::SignalBase<int>_*>::~allocator(&local_19);
  uVar1 = (*(local_18->super_SignalArray_const<int>)._vptr_SignalArray_const[4])();
  this->size = uVar1;
  uVar1 = (*(local_18->super_SignalArray_const<int>)._vptr_SignalArray_const[4])();
  this->rank = uVar1;
  for (local_30[0] = 0; local_30[0] < this->rank; local_30[0] = local_30[0] + 1) {
    iVar2 = (*(local_18->super_SignalArray_const<int>)._vptr_SignalArray_const[3])
                      (local_18,local_30);
    ppSVar3 = std::
              vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
              ::operator[](&this->const_array,(ulong)local_30[0]);
    *ppSVar3 = (value_type)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

SignalArray_const<Time>(const SignalArray<Time> &siga)
      : const_array(siga.getSize()),
        size(siga.getSize()),
        rank(siga.getSize()) {
    for (unsigned int i = 0; i < rank; ++i) const_array[i] = &siga[i];
  }